

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3FindCollSeq(sqlite3 *db,u8 enc,char *zName,int create)

{
  long in_RDX;
  undefined1 in_SIL;
  char *in_RDI;
  CollSeq *pColl;
  CollSeq *local_28;
  undefined3 in_stack_fffffffffffffff4;
  uint create_00;
  
  create_00 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  if (in_RDX == 0) {
    local_28 = *(CollSeq **)(in_RDI + 0x10);
  }
  else {
    local_28 = findCollSeqEntry((sqlite3 *)pColl,in_RDI,create_00);
    if (local_28 != (CollSeq *)0x0) {
      local_28 = local_28 + (int)((create_00 >> 0x18) - 1);
    }
  }
  return local_28;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3FindCollSeq(
  sqlite3 *db,          /* Database connection to search */
  u8 enc,               /* Desired text encoding */
  const char *zName,    /* Name of the collating sequence.  Might be NULL */
  int create            /* True to create CollSeq if doesn't already exist */
){
  CollSeq *pColl;
  assert( SQLITE_UTF8==1 && SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
  assert( enc>=SQLITE_UTF8 && enc<=SQLITE_UTF16BE );
  if( zName ){
    pColl = findCollSeqEntry(db, zName, create);
    if( pColl ) pColl += enc-1;
  }else{
    pColl = db->pDfltColl;
  }
  return pColl;
}